

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O3

MPP_RET hal_h265e_v510_ret_task(void *hal,HalEncTask *task)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  long lVar7;
  EncRcTask *pEVar8;
  EncRcTask *pEVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  byte bVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  RK_U32 RVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  bool bVar33;
  
  lVar7 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  pEVar8 = task->rc_task;
  sVar18 = mpp_packet_get_length(task->packet);
  bVar33 = true;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0xa06);
    bVar33 = (hal_h265e_debug & 4) == 0;
  }
  pEVar9 = task->rc_task;
  lVar20 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  iVar27 = *(int *)(*(long *)((long)hal + 0x390) + 0xc);
  iVar21 = *(int *)(*(long *)((long)hal + 0x390) + 0x10);
  puVar10 = *(uint **)(lVar20 + 0x20);
  uVar17 = *puVar10;
  if (!bVar33) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x8c8);
  }
  RVar24 = hal_h265e_debug;
  *(int *)(lVar20 + 0x30) = *(int *)(lVar20 + 0x30) + puVar10[4];
  *(int *)(lVar20 + 0x34) = *(int *)(lVar20 + 0x34) + puVar10[1];
  *(long *)(lVar20 + 0x40) =
       *(long *)(lVar20 + 0x40) + (ulong)(puVar10[3] << 0x10 | puVar10[2] >> 0x10);
  *(uint *)(lVar20 + 0x28) = uVar17;
  if ((RVar24 & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","hw_status: 0x%08x",(char *)0x0,(ulong)uVar17);
  }
  if ((uVar17 & 2) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_LINKTABLE_FINISH","vepu510_h265_set_feedback");
  }
  if (((uVar17 & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
  }
  if (((uVar17 & 8) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","RKV_ENC_INT_ONE_SLICE_FINISH",(char *)0x0);
  }
  if ((uVar17 & 4) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_SAFE_CLEAR_FINISH","vepu510_h265_set_feedback");
  }
  if ((uVar17 & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BIT_STREAM_OVERFLOW","vepu510_h265_set_feedback");
  }
  if ((uVar17 & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_WRITE_FULL","vepu510_h265_set_feedback");
  }
  if ((uVar17 & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_WRITE_ERROR","vepu510_h265_set_feedback");
  }
  iVar27 = (iVar21 + 7U & 0x1ffffff8) * (iVar27 + 7U & 0xfffffff8);
  if ((char)uVar17 < '\0') {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_READ_ERROR","vepu510_h265_set_feedback");
  }
  uVar28 = iVar27 >> 4;
  if ((uVar17 >> 8 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_TIMEOUT_ERROR","vepu510_h265_set_feedback");
  }
  *(int *)(lVar20 + 0x140) = *(int *)(lVar20 + 0x140) + (puVar10[0x29] & 0x7fffff);
  *(int *)(lVar20 + 0x48) = *(int *)(lVar20 + 0x48) + (puVar10[0x21] & 0x1ffff);
  *(int *)(lVar20 + 0x4c) = *(int *)(lVar20 + 0x4c) + (puVar10[0x22] & 0x7ffff);
  iVar29 = (puVar10[0x25] & 0x7ffff) + *(int *)(lVar20 + 0x58);
  *(int *)(lVar20 + 0x58) = iVar29;
  *(int *)(lVar20 + 0x50) = *(int *)(lVar20 + 0x50) + (puVar10[0x23] & 0x1fffff);
  iVar31 = (puVar10[0x26] & 0x1fffff) + *(int *)(lVar20 + 0x5c);
  *(int *)(lVar20 + 0x5c) = iVar31;
  *(int *)(lVar20 + 0x54) = *(int *)(lVar20 + 0x54) + (puVar10[0x24] & 0x7fffff);
  iVar21 = (puVar10[0x27] & 0x7fffff) + *(int *)(lVar20 + 0x60);
  *(int *)(lVar20 + 0x60) = iVar21;
  iVar22 = (puVar10[0x28] & 0x7fffff) + *(int *)(lVar20 + 100);
  *(int *)(lVar20 + 100) = iVar22;
  *(uint *)((long)hal + 0x200) = puVar10[0x52] >> 0xf;
  *(uint *)((long)hal + 0x204) = puVar10[0x53] >> 0xf;
  *(uint *)((long)hal + 0x208) = puVar10[0x4e];
  uVar17 = iVar27 >> 6;
  *(uint *)((long)hal + 0x1e4) = puVar10[0x29] & 0x7fffff;
  memcpy((void *)(lVar20 + 0x68),puVar10 + 0x61,0xd0);
  if (0 < (int)uVar28) {
    (pEVar9->info).iblk4_prop =
         (uint)((iVar22 + iVar21) * 0x400 + iVar29 * 0x4000 + iVar31 * 0x1000) / uVar28;
  }
  if (0 < (int)uVar17) {
    (pEVar9->info).quality_real = *(uint *)(lVar20 + 0x30) / uVar17;
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0x905);
  }
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar18,*(RK_U32 *)(lVar7 + 0x34),"hal_h265e_v510_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)(lVar7 + 0x34));
  (pEVar8->info).sse = *(RK_S64 *)(lVar7 + 0x40);
  uVar14 = *(undefined8 *)(lVar7 + 0x48);
  uVar15 = *(undefined8 *)(lVar7 + 0x50);
  (pEVar8->info).lvl64_inter_num = (int)uVar14;
  (pEVar8->info).lvl32_inter_num = (int)((ulong)uVar14 >> 0x20);
  (pEVar8->info).lvl16_inter_num = (int)uVar15;
  (pEVar8->info).lvl8_inter_num = (int)((ulong)uVar15 >> 0x20);
  uVar14 = *(undefined8 *)(lVar7 + 0x58);
  uVar15 = *(undefined8 *)(lVar7 + 0x60);
  (pEVar8->info).lvl32_intra_num = (int)uVar14;
  (pEVar8->info).lvl16_intra_num = (int)((ulong)uVar14 >> 0x20);
  (pEVar8->info).lvl8_intra_num = (int)uVar15;
  (pEVar8->info).lvl4_intra_num = (int)((ulong)uVar15 >> 0x20);
  iVar27 = *(int *)(lVar7 + 0x34);
  task->hw_length = iVar27;
  task->length = task->length + iVar27;
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3a8),*(RK_S32 *)(lVar7 + 0x10));
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3a8),*(RK_S32 *)(lVar7 + 0x14));
  if (*(long **)((long)hal + 0x428) != (long *)0x0) {
    lVar20 = **(long **)((long)hal + 0x428);
    lVar11 = *(long *)(lVar20 + 0x80 + (long)(task->flags).reg_idx * 8);
    lVar12 = *(long *)(lVar11 + 0x20);
    iVar31 = (*(int *)(*(long *)(lVar20 + 0x390) + 0x10) + 0xfU & 0xffffff0) *
             (*(int *)(*(long *)(lVar20 + 0x390) + 0xc) + 0xfU & 0xfffffff0);
    uVar17 = *(uint *)(lVar12 + 0xc4);
    uVar28 = *(uint *)(lVar12 + 0xcc);
    uVar23 = *(uint *)(lVar12 + 0xd4);
    uVar1 = *(uint *)(lVar12 + 0xdc);
    iVar21 = (uVar1 >> 0x10) + (uVar23 >> 0x10) + (uVar28 >> 0x10) + (uVar17 >> 0x10);
    iVar22 = (*(uint *)(lVar12 + 0xe0) & 0xffff) + (*(uint *)(lVar12 + 0xd8) & 0xffff) +
             (*(uint *)(lVar12 + 0xd0) & 0xffff) + (*(uint *)(lVar12 + 200) & 0xffff);
    iVar27 = (*(uint *)(lVar12 + 0xe0) >> 0x10) + (*(uint *)(lVar12 + 0xd8) >> 0x10) +
             (*(uint *)(lVar12 + 0xd0) >> 0x10) + (*(uint *)(lVar12 + 200) >> 0x10);
    uVar2 = *(uint *)(lVar12 + 0xe4);
    uVar3 = *(uint *)(lVar12 + 0xec);
    uVar4 = *(uint *)(lVar12 + 0xf4);
    uVar5 = *(uint *)(lVar12 + 0xfc);
    iVar29 = (uVar5 >> 0x10) + (uVar4 >> 0x10) + (uVar3 >> 0x10) + (uVar2 >> 0x10);
    iVar30 = (*(uint *)(lVar12 + 0x100) & 0xffff) + (*(uint *)(lVar12 + 0xf8) & 0xffff) +
             (*(uint *)(lVar12 + 0xf0) & 0xffff) + (*(uint *)(lVar12 + 0xe8) & 0xffff);
    iVar32 = (*(uint *)(lVar12 + 0x100) >> 0x10) + (*(uint *)(lVar12 + 0xf8) >> 0x10) +
             (*(uint *)(lVar12 + 0xf0) >> 0x10) + (*(uint *)(lVar12 + 0xe8) >> 0x10);
    uVar25 = iVar31 >> 8;
    uVar16 = (((uint)(iVar22 * 5 + iVar27 * 6) >> 2) + iVar21) * 100;
    RVar24 = 2;
    if (uVar16 <= (iVar31 >> 3) + uVar25 * -2) {
      RVar24 = (RK_U32)(uVar25 * 0xd < uVar16);
    }
    pEVar8 = task->rc_task;
    lVar13 = *(long *)(lVar11 + 0x18);
    (pEVar8->info).complex_level = RVar24;
    if (*(int *)(lVar20 + 0x3f4) == 0) {
      uVar16 = iVar29 * 0x11 + iVar30 * 0x16 + iVar32 * 0x18;
    }
    else {
      uVar16 = iVar30 * 0xb + iVar29 * 8 + iVar32 * 0xc;
    }
    uVar16 = (uVar16 >> 2) * 100;
    RVar24 = 200;
    if ((uVar16 <= uVar25 * 0xf) && (RVar24 = 100, uVar16 <= uVar25 * 5)) {
      RVar24 = (RK_U32)(uVar25 >> 2 < uVar16);
    }
    iVar31 = (uVar28 & 0xffff) + (uVar17 & 0xffff) + (uVar23 & 0xffff) + (uVar1 & 0xffff);
    (pEVar8->info).motion_level = RVar24;
    if ((hal_h265e_debug & 0x40000) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","complex_level %d motion_level %d\n",(char *)0x0);
    }
    iVar26 = (uVar3 & 0xffff) + (uVar2 & 0xffff) + (uVar4 & 0xffff) + (uVar5 & 0xffff);
    uVar17 = *(uint *)(lVar13 + 0x24c);
    uVar23 = uVar17 >> 8 & 0xff;
    uVar28 = uVar17 >> 0x10 & 0xff;
    uVar17 = uVar28 * iVar27 + (uVar17 & 0xff) * iVar31 + ((uVar23 + (uVar17 & 0xff)) * iVar21 >> 1)
             + ((uVar23 + uVar28) * iVar22 >> 1);
    uVar28 = iVar31 + iVar21 + iVar22 + iVar27;
    if (uVar28 != 0) {
      uVar17 = uVar17 / uVar28;
    }
    *(uint *)(lVar11 + 0x13c) = uVar17;
    uVar23 = *(uint *)(lVar13 + 0x250) & 0xfff;
    uVar28 = *(uint *)(lVar13 + 0x250) >> 0x10 & 0xfff;
    uVar17 = *(uint *)(lVar13 + 0x254) & 0xfff;
    uVar17 = uVar17 * iVar32 + uVar23 * iVar26 + ((uVar28 + uVar23) * iVar29 >> 1) +
             ((uVar28 + uVar17) * iVar30 >> 1);
    uVar28 = iVar26 + iVar29 + iVar30 + iVar32;
    if (uVar28 != 0) {
      uVar17 = uVar17 / uVar28;
    }
    *(uint *)(lVar11 + 0x138) = uVar17;
    *(int *)(lVar11 + 0x140) = *(int *)(lVar11 + 0x140) + (*(uint *)(lVar12 + 0xa4) & 0x7fffff);
    *(uint *)(lVar11 + 0x2c) = *(uint *)&task->rc_task->frm >> 3 & 2;
    uVar17 = *(int *)(lVar11 + 0x34) * 8 + (pEVar8->info).bit_real;
    (pEVar8->info).bit_real = uVar17;
    if ((hal_h265e_debug & 0x40000) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","bit_real %d quality_real %d\n",(char *)0x0,(ulong)uVar17,
                 (ulong)(uint)(pEVar8->info).quality_real);
      uVar17 = (pEVar8->info).bit_real;
    }
    iVar27 = (pEVar8->info).bit_target;
    *(undefined2 *)(lVar11 + 0x170) = *(undefined2 *)(lVar20 + 0x360);
    uVar6 = *(undefined4 *)(lVar20 + 0x35c);
    *(undefined4 *)(lVar11 + 0x16c) = uVar6;
    *(undefined4 *)(lVar11 + 0x16d) = uVar6;
    if ((int)uVar17 < iVar27) {
      iVar21 = uVar17 * 6 + 3;
      if (-1 < (int)(uVar17 * 6)) {
        iVar21 = uVar17 * 6;
      }
      bVar19 = 3;
      if (iVar27 <= iVar21 >> 2) {
        iVar21 = uVar17 * 5 + 3;
        if (-1 < (int)(uVar17 * 5)) {
          iVar21 = uVar17 * 5;
        }
        bVar19 = 2;
        if (iVar27 <= iVar21 >> 2) {
          iVar21 = uVar17 * 9 + 7;
          if (-1 < (int)(uVar17 * 9)) {
            iVar21 = uVar17 * 9;
          }
          bVar19 = iVar21 >> 3 < iVar27;
        }
      }
    }
    else {
      bVar19 = 0xfb;
      if (uVar17 == iVar27 * 2 || SBORROW4(uVar17,iVar27 * 2) != (int)(uVar17 + iVar27 * -2) < 0) {
        iVar21 = iVar27 * 7;
        iVar22 = iVar21 + 3;
        if (-1 < iVar21) {
          iVar22 = iVar21;
        }
        bVar19 = 0xfc;
        if ((int)uVar17 <= iVar22 >> 2) {
          iVar21 = iVar27 * 6 + 3;
          if (-1 < iVar27 * 6) {
            iVar21 = iVar27 * 6;
          }
          bVar19 = 0xfd;
          if ((int)uVar17 <= iVar21 >> 2) {
            iVar21 = iVar27 * 5 + 3;
            if (-1 < iVar27 * 5) {
              iVar21 = iVar27 * 5;
            }
            bVar19 = ~(iVar21 >> 2 < (int)uVar17);
          }
        }
      }
    }
    *(byte *)(lVar11 + 0x16c) = bVar19;
    iVar27 = 0;
    lVar20 = -5;
    do {
      iVar27 = iVar27 + *(char *)(lVar11 + 0x171 + lVar20);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
    if (((ulong)task->rc_task->frm & 0x10) != 0) {
      *(undefined1 *)(lVar11 + 0x171) = 0;
    }
    if (iVar27 < -9) {
      *(undefined1 *)(lVar11 + 0x171) = 2;
    }
    else if ((iVar27 < -2) && (*(char *)(lVar11 + 0x171) < '\x02')) {
      *(undefined1 *)(lVar11 + 0x171) = 1;
    }
    uVar17 = 0;
    uVar28 = 0;
    if (*(uint *)(lVar11 + 0x140) != 0) {
      uVar28 = *(uint *)(lVar11 + 0x13c) / *(uint *)(lVar11 + 0x140);
    }
    *(uint *)(lVar11 + 0x13c) = uVar28;
    if (*(uint *)(lVar11 + 0x144) != 0) {
      uVar17 = *(uint *)(lVar11 + 0x138) / *(uint *)(lVar11 + 0x144);
    }
    *(uint *)(lVar11 + 0x138) = uVar17;
    (pEVar8->info).madi = uVar28;
    (pEVar8->info).madp = uVar17;
  }
  if ((hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","output stream size %d\n",(char *)0x0,
               (ulong)*(uint *)(lVar7 + 0x34));
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0xa1f);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v510_ret_task(void *hal, HalEncTask *task)
{
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu510H265eFrmCfg *frm = ctx->frms[task_idx];
    Vepu510H265Fbk *fb = &frm->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu510_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    h265e_dpb_hal_end(ctx->dpb, frm->hal_curr_idx);
    h265e_dpb_hal_end(ctx->dpb, frm->hal_refr_idx);

    vepu510_h265e_tune_stat_update(ctx->tune, enc_task);

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);
    hal_h265e_leave();
    return MPP_OK;
}